

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.c
# Opt level: O2

uint32_t radix8sort_u64(uint64_t *keys_in_out,uint64_t *keys_temp,uint32_t *values_in_out,
                       uint32_t *values_temp,uint32_t size)

{
  uint32_t uVar1;
  
  uVar1 = radixsort_u64(8,keys_in_out,keys_temp,values_in_out,values_temp,size);
  return uVar1;
}

Assistant:

uint32_t radix8sort_u64(uint64_t* restrict keys_in_out, uint64_t* restrict keys_temp,
    uint32_t* restrict values_in_out, uint32_t* values_temp, uint32_t size)
{
    return radixsort_u64(8, keys_in_out, keys_temp, values_in_out, values_temp, size);
}